

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

void SSL_CTX_flush_sessions(SSL_CTX *ctx,long tm)

{
  lhash_st_SSL_SESSION *lh;
  MutexWriteLock lock;
  TIMEOUT_PARAM tp;
  MutexLockBase<&CRYPTO_MUTEX_lock_write,_&CRYPTO_MUTEX_unlock_write> local_30;
  SSL_CTX *local_28;
  long local_20;
  lhash_st_SSL_SESSION *local_18;
  
  lh = *(lhash_st_SSL_SESSION **)&(ctx->stats).sess_connect_good;
  if (lh != (lhash_st_SSL_SESSION *)0x0) {
    local_30.mu_ = (CRYPTO_MUTEX *)&ctx->cert_store;
    local_28 = ctx;
    local_20 = tm;
    local_18 = lh;
    CRYPTO_MUTEX_lock_write(local_30.mu_);
    lh_SSL_SESSION_doall_arg(lh,timeout_doall_arg,&local_28);
    bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_write,_&CRYPTO_MUTEX_unlock_write>::
    ~MutexLockBase(&local_30);
  }
  return;
}

Assistant:

void SSL_CTX_flush_sessions(SSL_CTX *ctx, uint64_t time) {
  TIMEOUT_PARAM tp;

  tp.ctx = ctx;
  tp.cache = ctx->sessions;
  if (tp.cache == NULL) {
    return;
  }
  tp.time = time;
  MutexWriteLock lock(&ctx->lock);
  lh_SSL_SESSION_doall_arg(tp.cache, timeout_doall_arg, &tp);
}